

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O3

bool __thiscall
dg::vr::ValueRelations::PlainValueIterator::nextViableValue(PlainValueIterator *this)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  bool bVar5;
  
  p_Var3 = (this->bucketIt)._M_node;
  bVar4 = true;
  if ((_Base_ptr)(this->valueIt)._M_current == p_Var3[1]._M_left) {
    p_Var1 = (this->endIt)._M_node;
    do {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      (this->bucketIt)._M_node = p_Var3;
      bVar5 = p_Var3 == p_Var1;
      bVar4 = !bVar5;
      if (bVar5) {
        return bVar4;
      }
      p_Var2 = p_Var3[1]._M_parent;
      (this->valueIt)._M_current = (Value **)p_Var2;
    } while (p_Var2 == p_Var3[1]._M_left);
  }
  return bVar4;
}

Assistant:

bool nextViableValue() {
            while (valueIt == bucketIt->second.end()) {
                if (++bucketIt == endIt)
                    return false;
                valueIt = bucketIt->second.begin();
            }
            return true;
        }